

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionIsAnAcceptor::RunImpl
          (TestsessionFixtureSessionIsAnAcceptor *this)

{
  TestDetails *details;
  sessionFixtureSessionIsAnAcceptorHelper fixtureHelper;
  sessionFixtureSessionIsAnAcceptorHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionIsAnAcceptorHelper::sessionFixtureSessionIsAnAcceptorHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionIsAnAcceptorHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionIsAnAcceptor) {
  createSession(0);
  CHECK(object->isAcceptor());
}